

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportCommand.cxx
# Opt level: O2

bool __thiscall
cmExportCommand::HandlePackage
          (cmExportCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  char *content;
  ostream *poVar3;
  ulong uVar4;
  long lVar5;
  allocator local_2b9;
  string local_2b8;
  string package;
  string hash;
  RegularExpression packageRegex;
  
  package._M_dataplus._M_p = (pointer)&package.field_2;
  package._M_string_length = 0;
  package.field_2._M_local_buf[0] = '\0';
  uVar4 = 1;
  lVar5 = 0x20;
  do {
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar4) {
      if (package._M_string_length == 0) {
        std::__cxx11::string::string
                  ((string *)&hash,"PACKAGE must be given a package name.",
                   (allocator *)&packageRegex);
        cmCommand::SetError(&this->super_cmCommand,&hash);
        std::__cxx11::string::~string((string *)&hash);
LAB_00323f24:
        bVar1 = false;
      }
      else {
        cmsys::RegularExpression::RegularExpression(&packageRegex,"^[A-Za-z0-9_.-]+$");
        bVar1 = cmsys::RegularExpression::find(&packageRegex,package._M_dataplus._M_p);
        if (bVar1) {
          this_00 = (this->super_cmCommand).Makefile;
          std::__cxx11::string::string
                    ((string *)&hash,"CMAKE_EXPORT_NO_PACKAGE_REGISTRY",(allocator *)&local_2b8);
          bVar2 = cmMakefile::IsOn(this_00,&hash);
          std::__cxx11::string::~string((string *)&hash);
          if (!bVar2) {
            content = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
            std::__cxx11::string::string((string *)&local_2b8,content,&local_2b9);
            cmSystemTools::ComputeStringMD5(&hash,&local_2b8);
            std::__cxx11::string::~string((string *)&local_2b8);
            StorePackageRegistryDir(this,&package,content,hash._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&hash);
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&hash);
          poVar3 = std::operator<<((ostream *)&hash,"PACKAGE given invalid package name \"");
          poVar3 = std::operator<<(poVar3,(string *)&package);
          poVar3 = std::operator<<(poVar3,"\".  ");
          poVar3 = std::operator<<(poVar3,"Package names must match \"");
          poVar3 = std::operator<<(poVar3,"^[A-Za-z0-9_.-]+$");
          std::operator<<(poVar3,"\".");
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&local_2b8);
          std::__cxx11::string::~string((string *)&local_2b8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&hash);
        }
        cmsys::RegularExpression::~RegularExpression(&packageRegex);
      }
      std::__cxx11::string::~string((string *)&package);
      return bVar1;
    }
    if ((int)uVar4 == 2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&hash);
      poVar3 = std::operator<<((ostream *)&hash,"PACKAGE given unknown argument: ");
      std::operator<<(poVar3,(string *)
                             ((long)&(((args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                     _M_p + lVar5));
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,(string *)&packageRegex);
      std::__cxx11::string::~string((string *)&packageRegex);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&hash);
      goto LAB_00323f24;
    }
    std::__cxx11::string::_M_assign((string *)&package);
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 0x20;
  } while( true );
}

Assistant:

bool cmExportCommand::HandlePackage(std::vector<std::string> const& args)
{
  // Parse PACKAGE mode arguments.
  enum Doing { DoingNone, DoingPackage };
  Doing doing = DoingPackage;
  std::string package;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    if(doing == DoingPackage)
      {
      package = args[i];
      doing = DoingNone;
      }
    else
      {
      std::ostringstream e;
      e << "PACKAGE given unknown argument: " << args[i];
      this->SetError(e.str());
      return false;
      }
    }

  // Verify the package name.
  if(package.empty())
    {
    this->SetError("PACKAGE must be given a package name.");
    return false;
    }
  const char* packageExpr = "^[A-Za-z0-9_.-]+$";
  cmsys::RegularExpression packageRegex(packageExpr);
  if(!packageRegex.find(package.c_str()))
    {
    std::ostringstream e;
    e << "PACKAGE given invalid package name \"" << package << "\".  "
      << "Package names must match \"" << packageExpr << "\".";
    this->SetError(e.str());
    return false;
    }

  // If the CMAKE_EXPORT_NO_PACKAGE_REGISTRY variable is set the command
  // export(PACKAGE) does nothing.
  if(this->Makefile->IsOn("CMAKE_EXPORT_NO_PACKAGE_REGISTRY"))
    {
    return true;
    }

  // We store the current build directory in the registry as a value
  // named by a hash of its own content.  This is deterministic and is
  // unique with high probability.
  const char* outDir = this->Makefile->GetCurrentBinaryDirectory();
  std::string hash = cmSystemTools::ComputeStringMD5(outDir);
#if defined(_WIN32) && !defined(__CYGWIN__)
  this->StorePackageRegistryWin(package, outDir, hash.c_str());
#else
  this->StorePackageRegistryDir(package, outDir, hash.c_str());
#endif

  return true;
}